

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int memjrnlRead(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  sqlite3_io_methods *psVar6;
  int iVar7;
  
  if ((iOfst == 0) || (pJfd[4].pMethods != (sqlite3_io_methods *)iOfst)) {
    psVar6 = (sqlite3_io_methods *)(pJfd + 1);
    lVar4 = 0x3f8;
    do {
      psVar6 = *(sqlite3_io_methods **)psVar6;
      if (psVar6 == (sqlite3_io_methods *)0x0) break;
      bVar1 = lVar4 <= iOfst;
      lVar4 = lVar4 + 0x3f8;
    } while (bVar1);
  }
  else {
    psVar6 = pJfd[5].pMethods;
  }
  iVar3 = (int)iOfst +
          (SUB164(SEXT816(iOfst) * SEXT816(0x4081020408102041),9) -
          (SUB164(SEXT816(iOfst) * SEXT816(0x4081020408102041),0xc) >> 0x1f)) * -0x3f8;
  iVar5 = iAmt;
  do {
    iVar7 = 0x3f8 - iVar3;
    iVar2 = iVar7;
    if (iVar5 < iVar7) {
      iVar2 = iVar5;
    }
    memcpy(zBuf,(void *)((long)&psVar6->xClose + (long)iVar3),(long)iVar2);
    iVar5 = iVar5 - iVar7;
    if ((iVar5 < 0) || (psVar6 = *(sqlite3_io_methods **)psVar6, iVar5 == 0)) break;
    zBuf = (void *)((long)zBuf + (long)iVar2);
    iVar3 = 0;
  } while (psVar6 != (sqlite3_io_methods *)0x0);
  pJfd[4].pMethods = (sqlite3_io_methods *)(iAmt + iOfst);
  pJfd[5].pMethods = psVar6;
  return 0;
}

Assistant:

static int memjrnlRead(
  sqlite3_file *pJfd,    /* The journal file from which to read */
  void *zBuf,            /* Put the results here */
  int iAmt,              /* Number of bytes to read */
  sqlite_int64 iOfst     /* Begin reading at this offset */
){
  MemJournal *p = (MemJournal *)pJfd;
  u8 *zOut = zBuf;
  int nRead = iAmt;
  int iChunkOffset;
  FileChunk *pChunk;

  /* SQLite never tries to read past the end of a rollback journal file */
  assert( iOfst+iAmt<=p->endpoint.iOffset );

  if( p->readpoint.iOffset!=iOfst || iOfst==0 ){
    sqlite3_int64 iOff = 0;
    for(pChunk=p->pFirst; 
        ALWAYS(pChunk) && (iOff+JOURNAL_CHUNKSIZE)<=iOfst;
        pChunk=pChunk->pNext
    ){
      iOff += JOURNAL_CHUNKSIZE;
    }
  }else{
    pChunk = p->readpoint.pChunk;
  }

  iChunkOffset = (int)(iOfst%JOURNAL_CHUNKSIZE);
  do {
    int iSpace = JOURNAL_CHUNKSIZE - iChunkOffset;
    int nCopy = MIN(nRead, (JOURNAL_CHUNKSIZE - iChunkOffset));
    memcpy(zOut, &pChunk->zChunk[iChunkOffset], nCopy);
    zOut += nCopy;
    nRead -= iSpace;
    iChunkOffset = 0;
  } while( nRead>=0 && (pChunk=pChunk->pNext)!=0 && nRead>0 );
  p->readpoint.iOffset = iOfst+iAmt;
  p->readpoint.pChunk = pChunk;

  return SQLITE_OK;
}